

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O2

void __thiscall
CCountryFlags::Render
          (CCountryFlags *this,int CountryCode,vec4 *pColor,float x,float y,float w,float h,
          bool AllowBlocked)

{
  float fVar1;
  long lVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  int iVar5;
  CCountryFlag *pCVar6;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  CQuadItem QuadItem;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = GetByCountryCode(this,CountryCode);
  if (((int)CONCAT71(in_register_00000009,AllowBlocked) == 0) && (pCVar6->m_Blocked == true)) {
    pCVar6 = GetByCountryCode(this,-1);
  }
  if ((pCVar6->m_Texture).m_Id < 0) {
    if (Render(int,vector4_base<float>const*,float,float,float,float,bool)::s_Cursor == '\0') {
      iVar5 = __cxa_guard_acquire(&Render(int,vector4_base<float>const*,float,float,float,float,bool)
                                   ::s_Cursor);
      if (iVar5 != 0) {
        CTextCursor::CTextCursor(&Render::s_Cursor,10.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&Render::s_Cursor,&__dso_handle);
        __cxa_guard_release(&Render(int,vector4_base<float>const*,float,float,float,float,bool)::
                             s_Cursor);
      }
    }
    CTextCursor::Reset(&Render::s_Cursor,-1);
    Render::s_Cursor.m_MaxLines = (int)w;
    Render::s_Cursor.m_CursorPos.field_1.y = y + h * 0.5;
    Render::s_Cursor.m_CursorPos.field_0.x = x + w * 0.5;
    Render::s_Cursor.m_Align = 5;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&Render::s_Cursor,pCVar6->m_aCountryCodeString,0xffffffffffffffff);
      return;
    }
  }
  else {
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    fVar1 = (pColor->field_3).w;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              ((pColor->field_0).x * fVar1,(pColor->field_1).y * fVar1,(pColor->field_2).z * fVar1);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    QuadItem.m_X = x;
    QuadItem.m_Y = y;
    QuadItem.m_Width = w;
    QuadItem.m_Height = h;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&QuadItem,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CCountryFlags::Render(int CountryCode, const vec4 *pColor, float x, float y, float w, float h, bool AllowBlocked)
{
	const CCountryFlag *pFlag = GetByCountryCode(CountryCode);
	if(!AllowBlocked && pFlag->m_Blocked)
		pFlag = GetByCountryCode(-1);
	if(pFlag->m_Texture.IsValid())
	{
		Graphics()->TextureSet(pFlag->m_Texture);
		Graphics()->QuadsBegin();
		Graphics()->SetColor(pColor->r*pColor->a, pColor->g*pColor->a, pColor->b*pColor->a, pColor->a);
		IGraphics::CQuadItem QuadItem(x, y, w, h);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
	else
	{
		static CTextCursor s_Cursor(10.0f);
		s_Cursor.Reset();
		s_Cursor.MoveTo(x+w/2, y+h/2);
		s_Cursor.m_MaxLines = w;
		s_Cursor.m_Align = TEXTALIGN_MC;
		TextRender()->TextOutlined(&s_Cursor, pFlag->m_aCountryCodeString, -1);
	}
}